

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cc
# Opt level: O2

void __thiscall phosg::BitmapImage::BitmapImage(BitmapImage *this,BitmapImage *im)

{
  size_t sVar1;
  
  sVar1 = im->height;
  this->width = im->width;
  this->height = sVar1;
  this->row_bytes = im->row_bytes;
  this->data = im->data;
  im->row_bytes = 0;
  im->data = (uint8_t *)0x0;
  im->width = 0;
  im->height = 0;
  return;
}

Assistant:

BitmapImage::BitmapImage(BitmapImage&& im) {
  this->width = im.width;
  this->height = im.height;
  this->row_bytes = im.row_bytes;
  this->data = im.data;
  im.width = 0;
  im.height = 0;
  im.row_bytes = 0;
  im.data = nullptr;
}